

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TType::shallowCopy(TType *this,TType *copyOf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  undefined6 uVar15;
  undefined3 uVar16;
  bool bVar17;
  bool bVar18;
  undefined1 uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  uint uVar24;
  TType *copyOf_local;
  TType *this_local;
  
  this->field_0x8 = copyOf->field_0x8;
  this->sampler = copyOf->sampler;
  bVar23 = (copyOf->qualifier).layoutBindlessSampler;
  bVar14 = (copyOf->qualifier).layoutBindlessImage;
  uVar15 = *(undefined6 *)&(copyOf->qualifier).field_0x4a;
  (this->qualifier).spirvDecorate = (copyOf->qualifier).spirvDecorate;
  (this->qualifier).layoutBindlessSampler = bVar23;
  (this->qualifier).layoutBindlessImage = bVar14;
  *(undefined6 *)&(this->qualifier).field_0x4a = uVar15;
  uVar1 = *(undefined4 *)&(copyOf->qualifier).semanticName;
  uVar2 = *(undefined4 *)((long)&(copyOf->qualifier).semanticName + 4);
  uVar3 = *(undefined4 *)&(copyOf->qualifier).field_0x8;
  uVar4 = *(undefined4 *)&(copyOf->qualifier).field_0xc;
  uVar5 = *(undefined4 *)&(copyOf->qualifier).field_0x10;
  iVar6 = (copyOf->qualifier).layoutOffset;
  iVar7 = (copyOf->qualifier).layoutAlign;
  uVar8 = *(undefined4 *)&(copyOf->qualifier).field_0x1c;
  uVar9 = *(undefined4 *)&(copyOf->qualifier).field_0x20;
  uVar10 = *(undefined4 *)&(copyOf->qualifier).field_0x24;
  uVar11 = *(undefined4 *)&(copyOf->qualifier).field_0x28;
  uVar19 = (copyOf->qualifier).field_0x2c;
  bVar20 = (copyOf->qualifier).layoutPushConstant;
  bVar21 = (copyOf->qualifier).layoutBufferReference;
  bVar22 = (copyOf->qualifier).layoutPassthrough;
  uVar16 = *(undefined3 *)&(copyOf->qualifier).field_0x31;
  iVar12 = (copyOf->qualifier).layoutSecondaryViewportRelativeOffset;
  bVar23 = (copyOf->qualifier).layoutShaderRecord;
  bVar14 = (copyOf->qualifier).layoutFullQuads;
  bVar17 = (copyOf->qualifier).layoutQuadDeriv;
  bVar18 = (copyOf->qualifier).layoutHitObjectShaderRecordNV;
  iVar13 = (copyOf->qualifier).spirvStorageClass;
  (this->qualifier).layoutViewportRelative = (copyOf->qualifier).layoutViewportRelative;
  *(undefined3 *)&(this->qualifier).field_0x31 = uVar16;
  (this->qualifier).layoutSecondaryViewportRelativeOffset = iVar12;
  (this->qualifier).layoutShaderRecord = bVar23;
  (this->qualifier).layoutFullQuads = bVar14;
  (this->qualifier).layoutQuadDeriv = bVar17;
  (this->qualifier).layoutHitObjectShaderRecordNV = bVar18;
  (this->qualifier).spirvStorageClass = iVar13;
  *(undefined4 *)&(this->qualifier).field_0x20 = uVar9;
  *(undefined4 *)&(this->qualifier).field_0x24 = uVar10;
  *(undefined4 *)&(this->qualifier).field_0x28 = uVar11;
  (this->qualifier).field_0x2c = uVar19;
  (this->qualifier).layoutPushConstant = bVar20;
  (this->qualifier).layoutBufferReference = bVar21;
  (this->qualifier).layoutPassthrough = bVar22;
  *(undefined4 *)&(this->qualifier).field_0x10 = uVar5;
  (this->qualifier).layoutOffset = iVar6;
  (this->qualifier).layoutAlign = iVar7;
  *(undefined4 *)&(this->qualifier).field_0x1c = uVar8;
  *(undefined4 *)&(this->qualifier).semanticName = uVar1;
  *(undefined4 *)((long)&(this->qualifier).semanticName + 4) = uVar2;
  *(undefined4 *)&(this->qualifier).field_0x8 = uVar3;
  *(undefined4 *)&(this->qualifier).field_0xc = uVar4;
  *(uint *)&this->field_0x8 =
       *(uint *)&this->field_0x8 & 0xfffff0ff | *(uint *)&copyOf->field_0x8 & 0xf00;
  *(uint *)&this->field_0x8 =
       *(uint *)&this->field_0x8 & 0xffff0fff | *(uint *)&copyOf->field_0x8 & 0xf000;
  *(uint *)&this->field_0x8 =
       *(uint *)&this->field_0x8 & 0xfff0ffff | *(uint *)&copyOf->field_0x8 & 0xf0000;
  *(uint *)&this->field_0x8 =
       *(uint *)&this->field_0x8 & 0xffefffff |
       (uint)((byte)(*(uint *)&copyOf->field_0x8 >> 0x14) & 1) << 0x14;
  this->arraySizes = copyOf->arraySizes;
  this->fieldName = copyOf->fieldName;
  this->typeName = copyOf->typeName;
  uVar24 = (*this->_vptr_TType[0x25])();
  if ((uVar24 & 1) == 0) {
    this->field_13 = copyOf->field_13;
  }
  else {
    this->field_13 = copyOf->field_13;
  }
  this->typeParameters = copyOf->typeParameters;
  this->spirvType = copyOf->spirvType;
  bVar23 = isCoopMatNV(copyOf);
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffdfffff | (uint)bVar23 << 0x15;
  bVar23 = isCoopMatKHR(copyOf);
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffbfffff | (uint)bVar23 << 0x16;
  *(uint *)&this->field_0x8 =
       *(uint *)&this->field_0x8 & 0xfc7fffff | *(uint *)&copyOf->field_0x8 & 0x3800000;
  *(uint *)&this->field_0x8 =
       *(uint *)&this->field_0x8 & 0xfbffffff |
       (uint)((byte)((uint)*(undefined4 *)&copyOf->field_0x8 >> 0x1a) & 1) << 0x1a;
  bVar23 = isCoopVecNV(copyOf);
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xf7ffffff | (uint)bVar23 << 0x1b;
  return;
}

Assistant:

void shallowCopy(const TType& copyOf)
    {
        basicType = copyOf.basicType;
        sampler = copyOf.sampler;
        qualifier = copyOf.qualifier;
        vectorSize = copyOf.vectorSize;
        matrixCols = copyOf.matrixCols;
        matrixRows = copyOf.matrixRows;
        vector1 = copyOf.vector1;
        arraySizes = copyOf.arraySizes;  // copying the pointer only, not the contents
        fieldName = copyOf.fieldName;
        typeName = copyOf.typeName;
        if (isStruct()) {
            structure = copyOf.structure;
        } else {
            referentType = copyOf.referentType;
        }
        typeParameters = copyOf.typeParameters;
        spirvType = copyOf.spirvType;
        coopmatNV = copyOf.isCoopMatNV();
        coopmatKHR = copyOf.isCoopMatKHR();
        coopmatKHRuse = copyOf.coopmatKHRuse;
        coopmatKHRUseValid = copyOf.coopmatKHRUseValid;
        coopvecNV = copyOf.isCoopVecNV();
    }